

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::addIgnoreCommand_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view value)

{
  size_type __n;
  size_type sVar1;
  optional<int> oVar2;
  _Storage<int,_true> *p_Var3;
  size_type *psVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> value_00;
  format_args args;
  allocator<char> local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string local_78;
  key_type local_50;
  
  local_88._M_str = value._M_str;
  local_88._M_len = value._M_len;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_88,',',0);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&local_88,',',0xffffffffffffffff);
  if ((__n == 0xffffffffffffffff) || (__n != sVar1)) {
    local_78._M_dataplus._M_p = local_88._M_str;
    local_78._M_string_length = local_88._M_len;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_78;
    ::fmt::v9::vformat_abi_cxx11_
              (__return_storage_ptr__,(v9 *)"missing or extra comma in argument \'{}\'",fmt,args);
  }
  else {
    value_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_88,__n + 1,0xffffffffffffffff);
    local_88 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_88,0,__n);
    paVar5 = &local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar5;
    oVar2 = parseInt<int>((string_view)(ZEXT816(0x344831) << 0x40),value_00,&local_78);
    if (((ulong)oVar2.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar5) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0])
        ;
      }
      psVar4 = &local_78._M_string_length;
      __return_storage_ptr__->_M_string_length = local_78._M_string_length;
      local_78._M_dataplus._M_p = (pointer)paVar5;
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_50,&local_88,&local_89);
      p_Var3 = (_Storage<int,_true> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->cmdIgnore,&local_50);
      p_Var3->_M_value =
           oVar2.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      std::__cxx11::string::~string((string *)&local_50);
      paVar5 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar5;
      psVar4 = &__return_storage_ptr__->_M_string_length;
    }
    *psVar4 = 0;
    paVar5->_M_local_buf[0] = '\0';
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::addIgnoreCommand(string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const string_view numArgs = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);

    std::string error;
    auto result = parseInt<int>("", numArgs, error);
    if (result) {
        cmdIgnore[std::string(value)] = *result;
        return {};
    }
    return error;
}